

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

bilingual_str *
common::TransactionErrorString(bilingual_str *__return_storage_ptr__,TransactionError err)

{
  string *this;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffee8;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(err) {
  case OK:
    std::__cxx11::string::string<std::allocator<char>>
              (local_30,"No error",(allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = local_30;
    break;
  case MISSING_INPUTS:
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"Inputs missing or spent",(allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = local_50;
    break;
  case ALREADY_IN_UTXO_SET:
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,"Transaction outputs already in utxo set",
               (allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = local_70;
    break;
  case MEMPOOL_REJECTED:
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,"Transaction rejected by mempool",
               (allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = local_90;
    break;
  case MEMPOOL_ERROR:
    std::__cxx11::string::string<std::allocator<char>>
              (local_b0,"Mempool internal error",(allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = local_b0;
    break;
  case MAX_FEE_EXCEEDED:
    std::__cxx11::string::string<std::allocator<char>>
              (local_d0,"Fee exceeds maximum configured by user (e.g. -maxtxfee, maxfeerate)",
               (allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = local_d0;
    break;
  case MAX_BURN_EXCEEDED:
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"Unspendable output exceeds maximum configured by user (maxburnamount)",
               (allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = local_f0;
    break;
  case INVALID_PACKAGE:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffef0,"Transaction rejected due to invalid package",
               (allocator<char> *)&stack0xfffffffffffffeef);
    Untranslated(__return_storage_ptr__,in_stack_fffffffffffffee8);
    this = (string *)&stack0xfffffffffffffef0;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/messages.cpp"
                  ,0x91,"bilingual_str common::TransactionErrorString(const TransactionError)");
  }
  std::__cxx11::string::~string(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

bilingual_str TransactionErrorString(const TransactionError err)
{
    switch (err) {
        case TransactionError::OK:
            return Untranslated("No error");
        case TransactionError::MISSING_INPUTS:
            return Untranslated("Inputs missing or spent");
        case TransactionError::ALREADY_IN_UTXO_SET:
            return Untranslated("Transaction outputs already in utxo set");
        case TransactionError::MEMPOOL_REJECTED:
            return Untranslated("Transaction rejected by mempool");
        case TransactionError::MEMPOOL_ERROR:
            return Untranslated("Mempool internal error");
        case TransactionError::MAX_FEE_EXCEEDED:
            return Untranslated("Fee exceeds maximum configured by user (e.g. -maxtxfee, maxfeerate)");
        case TransactionError::MAX_BURN_EXCEEDED:
            return Untranslated("Unspendable output exceeds maximum configured by user (maxburnamount)");
        case TransactionError::INVALID_PACKAGE:
            return Untranslated("Transaction rejected due to invalid package");
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}